

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O1

int BIO_hexdump(BIO *bio,uint8_t *data,size_t len,uint indent)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  hexdump_ctx ctx;
  char local_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char local_6f;
  char local_6e;
  char local_6d;
  undefined2 local_6c;
  BIO *local_68;
  uint8_t auStack_60 [16];
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  
  auStack_60[0] = '\0';
  auStack_60[1] = '\0';
  auStack_60[2] = '\0';
  auStack_60[3] = '\0';
  auStack_60[4] = '\0';
  auStack_60[5] = '\0';
  auStack_60[6] = '\0';
  auStack_60[7] = '\0';
  local_48 = 0;
  auStack_60[8] = '\0';
  auStack_60[9] = '\0';
  auStack_60[10] = '\0';
  auStack_60[0xb] = '\0';
  auStack_60[0xc] = '\0';
  auStack_60[0xd] = '\0';
  auStack_60[0xe] = '\0';
  auStack_60[0xf] = '\0';
  uStack_50 = 0;
  uStack_40 = (ulong)indent;
  bVar6 = len == 0;
  local_68 = (BIO *)bio;
  if (!bVar6) {
    bVar6 = false;
    uVar5 = 1;
    do {
      if (uStack_50._4_4_ == 0) {
        BIO_indent(local_68,(int)uStack_40,-1);
        local_74 = "0123456789abcdef"[local_48 >> 0x1c & 0xf];
        cStack_73 = "0123456789abcdef"[(uint)(local_48 >> 0x18) & 0xf];
        cStack_72 = "0123456789abcdef"[(uint)(local_48 >> 0x14) & 0xf];
        cStack_71 = "0123456789abcdef"[(uint)(local_48 >> 0x10) & 0xf];
        cStack_70 = "0123456789abcdef"[(uint)(local_48 >> 0xc) & 0xf];
        local_6f = "0123456789abcdef"[(uint)(local_48 >> 8) & 0xf];
        local_6e = "0123456789abcdef"[(uint)(local_48 >> 4) & 0xf];
        local_6d = "0123456789abcdef"[(uint)local_48 & 0xf];
        local_6c = 0x2020;
        iVar2 = BIO_write(local_68,&local_74,10);
        if (iVar2 < 0) break;
      }
      local_74 = "0123456789abcdef"[data[uVar5 - 1] >> 4];
      cStack_73 = "0123456789abcdef"[data[uVar5 - 1] & 0xf];
      cStack_72 = 0x20;
      if (uStack_50._4_4_ == 0xf) {
        cStack_71 = ' ';
        cStack_70 = '|';
        iVar2 = 5;
      }
      else {
        iVar2 = 3;
        if (uStack_50._4_4_ == 7) {
          cStack_71 = ' ';
          iVar2 = 4;
        }
      }
      iVar2 = BIO_write(local_68,&local_74,iVar2);
      if (iVar2 < 0) break;
      uVar1 = data[uVar5 - 1];
      if ((byte)(data[uVar5 - 1] + 0x81) < 0xa1) {
        uVar1 = '.';
      }
      auStack_60[uStack_50 >> 0x20] = uVar1;
      iVar2 = uStack_50._4_4_ + 1;
      uStack_50 = CONCAT44(iVar2,(undefined4)uStack_50);
      local_48 = local_48 + 1;
      if (iVar2 == 0x10) {
        uStack_50 = CONCAT62(uStack_50._2_6_,0xa7c);
        iVar2 = BIO_write(local_68,auStack_60,0x12);
        if (iVar2 < 0) break;
        uStack_50 = uStack_50 & 0xffffffff;
      }
      bVar6 = len <= uVar5;
      bVar7 = uVar5 != len;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  uVar4 = 0;
  if (bVar6) {
    uVar4 = uStack_50._4_4_;
    uVar5 = (ulong)uStack_50._4_4_;
    if (uVar5 == 0) {
      uVar4 = 1;
    }
    else {
      local_74 = ' ';
      cStack_73 = 0x20;
      cStack_72 = 0x20;
      cStack_71 = 0x20;
      cStack_70 = 0x7c;
      if (uStack_50._4_4_ < 0x10) {
        uVar3 = uStack_50._4_4_;
        do {
          iVar2 = (uint)(uVar3 == 0xf) * 2 + 3;
          if (uVar3 == 7) {
            iVar2 = 4;
          }
          iVar2 = BIO_write(local_68,&local_74,iVar2);
          if (iVar2 < 0) {
            return 0;
          }
          uVar3 = uStack_50._4_4_ + 1;
          uStack_50 = CONCAT44(uVar3,(undefined4)uStack_50);
        } while (uVar3 < 0x10);
      }
      auStack_60[uVar5] = '|';
      auStack_60[uVar4 + 1] = '\n';
      uVar4 = BIO_write(local_68,auStack_60,uVar4 + 2);
      uVar4 = ~uVar4 >> 0x1f;
    }
  }
  return uVar4;
}

Assistant:

int BIO_hexdump(BIO *bio, const uint8_t *data, size_t len, unsigned indent) {
  struct hexdump_ctx ctx;
  OPENSSL_memset(&ctx, 0, sizeof(ctx));
  ctx.bio = bio;
  ctx.indent = indent;

  if (!hexdump_write(&ctx, data, len) || !finish(&ctx)) {
    return 0;
  }

  return 1;
}